

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O2

void mapHeatIce(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  ulong local_38;
  
  uVar4 = (ulong)(uint)areaHeight;
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),areaWidth + 2,
                  areaHeight + 2);
  uVar1 = 0;
  if (0 < areaWidth) {
    uVar1 = (ulong)(uint)areaWidth;
  }
  lVar2 = (long)areaWidth;
  local_38 = 0;
  if (areaHeight < 1) {
    uVar4 = 0;
  }
  piVar7 = out + lVar2 + 3;
  piVar8 = out + lVar2 * 2 + 5;
  lVar5 = (lVar2 << 0x20) + 0x400000000;
  piVar10 = out;
  piVar11 = out;
  while (local_38 != uVar4) {
    local_38 = local_38 + 1;
    lVar6 = lVar5;
    for (lVar3 = 0; uVar1 * 4 != lVar3; lVar3 = lVar3 + 4) {
      iVar9 = *(int *)((long)piVar7 + lVar3);
      if (iVar9 == 4) {
        iVar9 = 4 - (uint)(*(int *)((long)piVar8 + lVar3) - 1U < 2 ||
                          ((*(int *)((long)piVar7 + lVar3 + -4) - 1U < 2 ||
                           *(int *)((long)piVar10 + lVar3 + 4) - 1U < 2) ||
                          *(int *)((long)out + (lVar6 >> 0x1e)) - 1U < 2));
      }
      *(int *)((long)piVar11 + lVar3) = iVar9;
      lVar6 = lVar6 + 0x100000000;
    }
    piVar11 = piVar11 + lVar2;
    piVar7 = piVar7 + lVar2 + 2;
    lVar5 = lVar5 + (lVar2 << 0x20) + 0x200000000;
    piVar8 = piVar8 + lVar2 + 2;
    piVar10 = piVar10 + lVar2 + 2;
  }
  return;
}

Assistant:

void mapHeatIce(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int) areaX - 1;
    int pZ = (int) areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 4) {
                int v10 = out[x + 1 + (z + 0) * pWidth];
                int v21 = out[x + 2 + (z + 1) * pWidth];
                int v01 = out[x + 0 + (z + 1) * pWidth];
                int v12 = out[x + 1 + (z + 2) * pWidth];

                if (v10 == 1 || v10 == 2 || v21 == 1 || v21 == 2 || v01 == 1 || v01 == 2 || v12 == 1 || v12 == 2) {
                    v11 = 3;
                }
            }

            out[x + z * areaWidth] = v11;
        }
    }
}